

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_optional.hpp
# Opt level: O1

void __thiscall
ak_toolbox::compact_optional_ns::detail_::buffer_storage<evp_minutes>::operator=
          (buffer_storage<evp_minutes> *this,buffer_storage<evp_minutes> *rhs)

{
  int iVar1;
  int iVar2;
  
  iVar1 = this->value_;
  iVar2 = rhs->value_;
  if (iVar1 != -1) {
    if (iVar2 != -1) {
      this->value_ = iVar2;
      return;
    }
    if ((iVar1 != -1) && (rhs->value_ == -1)) {
      destroy(this);
      return;
    }
    if (iVar1 != -1) {
      return;
    }
    iVar2 = rhs->value_;
  }
  if (iVar2 == -1) {
    return;
  }
  minutes_since_midnight::minutes_since_midnight
            ((minutes_since_midnight *)this,(minutes_since_midnight *)rhs);
  return;
}

Assistant:

void operator=(buffer_storage&& rhs)
    {
      if (has_value() && rhs.has_value())
      {
        as_value_type() = std::move(rhs.as_value_type());
      }
      else if (has_value() && !rhs.has_value())
      {
        destroy();
      }
      else if (!has_value() && rhs.has_value())
      {
        construct(std::move(rhs.as_value_type()));
      }
    }